

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

idx_t __thiscall
duckdb::GroupedAggregateHashTable::FindOrCreateGroupsInternal
          (GroupedAggregateHashTable *this,DataChunk *groups,Vector *group_hashes_v,
          Vector *addresses_v,SelectionVector *new_groups_out)

{
  DataChunk *this_00;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  ht_entry_t *phVar4;
  pointer pLVar5;
  sel_t *psVar6;
  hash_t hVar7;
  ulong uVar8;
  TupleDataChunkState *pTVar9;
  Vector *pVVar10;
  undefined8 this_01;
  Vector *pVVar11;
  GroupedAggregateHashTable *pGVar12;
  idx_t need_compare_idx;
  ulong uVar13;
  TupleDataLayout *pTVar14;
  reference pvVar15;
  reference other;
  pointer this_02;
  SelectionVector *pSVar16;
  type pTVar17;
  TupleDataLayout *pTVar18;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *puVar19;
  idx_t iVar20;
  InternalException *pIVar21;
  ulong uVar22;
  idx_t iVar23;
  PartitionedTupleDataAppendState *pPVar24;
  long lVar25;
  size_type __n;
  ulong uVar26;
  sel_t sVar27;
  idx_t iVar28;
  idx_t count;
  size_type __n_00;
  undefined1 auVar29 [16];
  double dVar30;
  optional_ptr<duckdb::PartitionedTupleDataAppendState,_true> local_110;
  Vector *local_108;
  idx_t local_100;
  TupleDataLayout *local_f8;
  DataChunk *local_f0;
  data_ptr_t local_e8;
  TupleDataLayout *local_e0;
  undefined1 local_d8 [32];
  idx_t no_match_count;
  PartitionedTupleDataAppendState *local_b0;
  shared_ptr<duckdb::TupleDataLayout,_true> *local_a8;
  Vector *local_a0;
  ulong local_98;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *local_90;
  TupleDataChunkState *local_88;
  PartitionedTupleDataAppendState *local_80;
  RowMatcher *local_78;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *local_70;
  SelectionVector *local_68;
  SelectionVector *local_60;
  GroupedAggregateHashTable *local_58;
  TupleDataChunkState *local_50;
  SelectionVector *local_48;
  sel_t *local_40;
  sel_t *local_38;
  
  iVar20 = groups->count;
  uVar13 = this->count + iVar20;
  uVar26 = this->capacity;
  local_108 = group_hashes_v;
  local_a0 = addresses_v;
  local_48 = new_groups_out;
  if ((uVar26 < uVar13) ||
     (auVar29._8_4_ = (int)(uVar26 >> 0x20), auVar29._0_8_ = uVar26, auVar29._12_4_ = 0x45300000,
     dVar30 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar26) - 4503599627370496.0)) / 1.25,
     uVar22 = (ulong)dVar30,
     ((long)(dVar30 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f | uVar22) < uVar13)) {
    Resize(this,uVar26 * 2);
  }
  local_f8 = (TupleDataLayout *)FlatVector::IncrementalSelectionVector();
  this_00 = &(this->state).group_chunk;
  if (*(pointer *)
       ((long)&(this->state).group_chunk.data.
               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data + 8) ==
      (this->state).group_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pTVar14 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                        (&(this->super_BaseAggregateHashTable).layout_ptr);
    DataChunk::InitializeEmpty(this_00,&pTVar14->types);
  }
  local_58 = this;
  if ((groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
  }
  else {
    __n_00 = 0;
    do {
      pvVar15 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n_00);
      other = vector<duckdb::Vector,_true>::operator[](&groups->data,__n_00);
      Vector::Reference(pvVar15,other);
      __n_00 = __n_00 + 1;
      __n = ((long)(groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (__n_00 < __n);
  }
  pGVar12 = local_58;
  local_b0 = &(local_58->state).partitioned_append_state;
  pvVar15 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
  pVVar10 = local_108;
  Vector::Reference(pvVar15,local_108);
  (pGVar12->state).group_chunk.count = groups->count;
  local_50 = &(pGVar12->state).partitioned_append_state.chunk_state;
  TupleDataCollection::ToUnifiedFormat(local_50,this_00);
  Vector::Flatten(pVVar10,iVar20);
  pVVar11 = local_a0;
  pdVar1 = pVVar10->data;
  Vector::Flatten(local_a0,iVar20);
  local_e8 = pVVar11->data;
  if (pGVar12->skip_lookups == false) {
    local_f0 = this_00;
    if (iVar20 == 0) {
      uVar26 = pGVar12->capacity;
    }
    else {
      pdVar2 = (pGVar12->state).ht_offsets.data;
      pdVar3 = (pGVar12->state).hash_salts.data;
      phVar4 = pGVar12->entries;
      pTVar14 = (TupleDataLayout *)0x0;
      iVar23 = 0;
      do {
        uVar26 = pGVar12->bitmask & *(ulong *)(pdVar1 + iVar23 * 8);
        *(ulong *)(pdVar2 + iVar23 * 8) = uVar26;
        pTVar14 = (TupleDataLayout *)
                  ((long)&(pTVar14->types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                  (ulong)(phVar4[uVar26].value != 0));
        *(ulong *)(pdVar3 + iVar23 * 8) = *(ulong *)(pdVar1 + iVar23 * 8) | 0xffffffffffff;
        iVar23 = iVar23 + 1;
      } while (iVar20 != iVar23);
      uVar26 = pGVar12->capacity;
      if (uVar26 != 0) {
        local_60 = &(pGVar12->state).group_compare_vector;
        local_68 = &(pGVar12->state).empty_vector;
        local_70 = &pGVar12->partitioned_data;
        local_80 = &(pGVar12->state).unpartitioned_append_state;
        local_88 = &(pGVar12->state).unpartitioned_append_state.chunk_state;
        local_90 = &pGVar12->unpartitioned_data;
        local_a8 = &(pGVar12->super_BaseAggregateHashTable).layout_ptr;
        local_78 = &pGVar12->row_matcher;
        local_e0 = (TupleDataLayout *)&(pGVar12->state).no_match_vector;
        local_100 = 0;
        uVar13 = 0;
        pTVar18 = local_f8;
        do {
          no_match_count = 0;
          pLVar5 = (pTVar18->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          phVar4 = pGVar12->entries;
          psVar6 = (pGVar12->state).group_compare_vector.sel_vector;
          local_38 = (pGVar12->state).empty_vector.sel_vector;
          local_40 = local_48->sel_vector;
          local_108 = (Vector *)0x0;
          count = 0;
          iVar23 = 0;
          do {
            iVar28 = iVar23;
            if (pLVar5 != (pointer)0x0) {
              iVar28 = (idx_t)*(uint *)((long)&pLVar5->id_ + iVar23 * 4);
            }
            if (uVar26 == 0) {
              uVar22 = 0;
            }
            else {
              hVar7 = *(hash_t *)(pdVar3 + iVar28 * 8);
              uVar26 = *(ulong *)(pdVar2 + iVar28 * 8);
              uVar22 = 0;
              do {
                uVar8 = phVar4[uVar26].value;
                sVar27 = (sel_t)iVar28;
                if (uVar8 == 0) {
                  phVar4[uVar26].value = hVar7;
                  local_38[(long)local_108] = sVar27;
                  local_108 = (Vector *)&local_108->field_0x1;
                  local_40[local_100] = sVar27;
                  local_100 = local_100 + 1;
                  break;
                }
                if ((uVar8 | 0xffffffffffff) == hVar7) {
                  psVar6[count] = sVar27;
                  count = count + 1;
                  break;
                }
                uVar26 = uVar26 + 1 & pGVar12->bitmask;
                *(ulong *)(pdVar2 + iVar28 * 8) = uVar26;
                uVar22 = uVar22 + 1;
              } while (uVar22 < pGVar12->capacity);
            }
            uVar26 = pGVar12->capacity;
            local_f8 = pTVar14;
            local_98 = uVar13;
            if (uVar22 == uVar26) {
              pIVar21 = (InternalException *)__cxa_allocate_exception(0x10);
              local_d8._0_8_ = local_d8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_d8,
                         "Maximum inner iteration count reached in GroupedAggregateHashTable","");
              InternalException::InternalException(pIVar21,(string *)local_d8);
              __cxa_throw(pIVar21,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 != iVar20);
          if ((TupleDataLayout *)(&local_108->vector_type + count) < pTVar14) {
            pIVar21 = (InternalException *)__cxa_allocate_exception(0x10);
            local_d8._0_8_ = local_d8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,"Internal validation failed in GroupedAggregateHashTable",
                       "");
            InternalException::InternalException(pIVar21,(string *)local_d8);
            __cxa_throw(pIVar21,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (local_108 != (Vector *)0x0) {
            local_d8._0_8_ = (PartitionedTupleData *)0x0;
            local_110.ptr = (PartitionedTupleDataAppendState *)0x0;
            puVar19 = local_70;
            pPVar24 = local_b0;
            if ((ulong)local_108 >> ((byte)pGVar12->radix_bits & 0x3f) < 5 &&
                2 < pGVar12->radix_bits) {
              TupleDataCollection::ToUnifiedFormat(local_88,local_f0);
              puVar19 = local_90;
              pPVar24 = local_80;
            }
            local_d8._0_8_ =
                 (puVar19->
                 super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
                 .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
            local_110.ptr = pPVar24;
            optional_ptr<duckdb::PartitionedTupleData,_true>::CheckValid
                      ((optional_ptr<duckdb::PartitionedTupleData,_true> *)local_d8);
            this_01 = local_d8._0_8_;
            optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::CheckValid(&local_110);
            pVVar10 = local_108;
            PartitionedTupleData::AppendUnified
                      ((PartitionedTupleData *)this_01,local_110.ptr,local_f0,local_68,
                       (idx_t)local_108);
            local_f8 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(local_a8);
            optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::CheckValid(&local_110);
            pTVar9 = &(local_110.ptr)->chunk_state;
            pSVar16 = FlatVector::IncrementalSelectionVector();
            RowOperations::InitializeStates(local_f8,&pTVar9->row_locations,pSVar16,(idx_t)pVVar10);
            optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::CheckValid(&local_110);
            pdVar1 = ((local_110.ptr)->chunk_state).row_locations.data;
            optional_ptr<duckdb::PartitionedTupleDataAppendState,_true>::CheckValid(&local_110);
            lVar25 = 0;
            do {
              uVar13 = (ulong)(pGVar12->state).empty_vector.sel_vector[lVar25];
              uVar26 = *(ulong *)(pdVar1 + (ulong)((local_110.ptr)->reverse_partition_sel).
                                                  sel_vector[uVar13] * 8);
              pGVar12->entries[*(long *)(pdVar2 + uVar13 * 8)].value =
                   pGVar12->entries[*(long *)(pdVar2 + uVar13 * 8)].value &
                   (uVar26 | 0xffff000000000000);
              *(ulong *)(local_e8 + uVar13 * 8) = uVar26;
              lVar25 = lVar25 + 1;
            } while (pVVar10 != (Vector *)lVar25);
          }
          if (count != 0) {
            iVar20 = 0;
            do {
              uVar26 = (ulong)(pGVar12->state).group_compare_vector.sel_vector[iVar20];
              *(hash_t *)(local_e8 + uVar26 * 8) =
                   pGVar12->entries[*(long *)(pdVar2 + uVar26 * 8)].value & 0xffffffffffff;
              iVar20 = iVar20 + 1;
            } while (count != iVar20);
            pTVar17 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(local_a8);
            RowMatcher::Match(local_78,local_f0,&local_50->vector_data,local_60,count,pTVar17,
                              local_a0,(SelectionVector *)local_e0,&no_match_count);
          }
          if (no_match_count == 0) {
            uVar13 = local_98 + 1;
            uVar26 = pGVar12->capacity;
            goto LAB_015bfe86;
          }
          pLVar5 = (local_e0->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar26 = 0;
          do {
            uVar13 = (ulong)*(uint *)((long)&pLVar5->id_ + uVar26 * 4);
            *(ulong *)(pdVar2 + uVar13 * 8) = *(long *)(pdVar2 + uVar13 * 8) + 1U & pGVar12->bitmask
            ;
            uVar26 = uVar26 + 1;
          } while (uVar26 < no_match_count);
          uVar13 = local_98 + 1;
          uVar26 = pGVar12->capacity;
          if ((no_match_count == 0) ||
             (pTVar14 = (TupleDataLayout *)0x0, pTVar18 = local_e0, iVar20 = no_match_count,
             uVar26 <= uVar13)) goto LAB_015bfe86;
        } while( true );
      }
    }
    uVar13 = 0;
    local_100 = 0;
LAB_015bfe86:
    iVar20 = local_100;
    if (uVar13 == uVar26) {
      pIVar21 = (InternalException *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = local_d8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,
                 "Maximum outer iteration count reached in GroupedAggregateHashTable","");
      InternalException::InternalException(pIVar21,(string *)local_d8);
      __cxa_throw(pIVar21,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    this_02 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
              ::operator->(&pGVar12->partitioned_data);
    pSVar16 = FlatVector::IncrementalSelectionVector();
    PartitionedTupleData::AppendUnified(this_02,local_b0,this_00,pSVar16,iVar20);
    pTVar17 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                        (&(pGVar12->super_BaseAggregateHashTable).layout_ptr);
    pSVar16 = FlatVector::IncrementalSelectionVector();
    RowOperations::InitializeStates
              (pTVar17,&(pGVar12->state).partitioned_append_state.chunk_state.row_locations,pSVar16,
               iVar20);
    if (iVar20 != 0) {
      pdVar1 = (pGVar12->state).partitioned_append_state.chunk_state.row_locations.data;
      iVar23 = 0;
      do {
        *(undefined8 *)(local_e8 + iVar23 * 8) =
             *(undefined8 *)
              (pdVar1 + (ulong)(pGVar12->state).partitioned_append_state.reverse_partition_sel.
                               sel_vector[iVar23] * 8);
        iVar23 = iVar23 + 1;
      } while (iVar20 != iVar23);
    }
  }
  pGVar12->count = pGVar12->count + iVar20;
  return iVar20;
}

Assistant:

idx_t GroupedAggregateHashTable::FindOrCreateGroupsInternal(DataChunk &groups, Vector &group_hashes_v,
                                                            Vector &addresses_v, SelectionVector &new_groups_out) {
	D_ASSERT(groups.ColumnCount() + 1 == layout_ptr->ColumnCount());
	D_ASSERT(group_hashes_v.GetType() == LogicalType::HASH);
	D_ASSERT(state.ht_offsets.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(state.ht_offsets.GetType() == LogicalType::UBIGINT);
	D_ASSERT(addresses_v.GetType() == LogicalType::POINTER);
	D_ASSERT(state.hash_salts.GetType() == LogicalType::HASH);

	// Need to fit the entire vector, and resize at threshold
	const auto chunk_size = groups.size();
	if (Count() + chunk_size > capacity || Count() + chunk_size > ResizeThreshold()) {
		Verify();
		Resize(capacity * 2);
	}
	D_ASSERT(capacity - Count() >= chunk_size); // we need to be able to fit at least one vector of data

	// we start out with all entries [0, 1, 2, ..., chunk_size]
	const SelectionVector *sel_vector = FlatVector::IncrementalSelectionVector();

	// Make a chunk that references the groups and the hashes and convert to unified format
	if (state.group_chunk.ColumnCount() == 0) {
		state.group_chunk.InitializeEmpty(layout_ptr->GetTypes());
	}
	D_ASSERT(state.group_chunk.ColumnCount() == layout_ptr->GetTypes().size());
	for (idx_t grp_idx = 0; grp_idx < groups.ColumnCount(); grp_idx++) {
		state.group_chunk.data[grp_idx].Reference(groups.data[grp_idx]);
	}
	state.group_chunk.data[groups.ColumnCount()].Reference(group_hashes_v);
	state.group_chunk.SetCardinality(groups);

	// convert all vectors to unified format
	TupleDataCollection::ToUnifiedFormat(state.partitioned_append_state.chunk_state, state.group_chunk);

	group_hashes_v.Flatten(chunk_size);
	const auto hashes = FlatVector::GetData<hash_t>(group_hashes_v);

	addresses_v.Flatten(chunk_size);
	const auto addresses = FlatVector::GetData<data_ptr_t>(addresses_v);

	if (skip_lookups) {
		// Just appending now
		partitioned_data->AppendUnified(state.partitioned_append_state, state.group_chunk,
		                                *FlatVector::IncrementalSelectionVector(), chunk_size);
		RowOperations::InitializeStates(*layout_ptr, state.partitioned_append_state.chunk_state.row_locations,
		                                *FlatVector::IncrementalSelectionVector(), chunk_size);

		const auto row_locations =
		    FlatVector::GetData<data_ptr_t>(state.partitioned_append_state.chunk_state.row_locations);
		const auto &row_sel = state.partitioned_append_state.reverse_partition_sel;
		for (idx_t i = 0; i < chunk_size; i++) {
			const auto &row_idx = row_sel[i];
			const auto &row_location = row_locations[row_idx];
			addresses[i] = row_location;
		}
		count += chunk_size;
		return chunk_size;
	}

	// Compute the entry in the table based on the hash using a modulo,
	// and precompute the hash salts for faster comparison below
	const auto ht_offsets = FlatVector::GetData<uint64_t>(state.ht_offsets);
	const auto hash_salts = FlatVector::GetData<hash_t>(state.hash_salts);

	// We also compute the occupied count, which is essentially useless.
	// However, this loop is branchless, while the main lookup loop below is not.
	// So, by doing the lookups here, we better amortize cache misses.
	idx_t occupied_count = 0;
	for (idx_t r = 0; r < chunk_size; r++) {
		const auto &hash = hashes[r];
		auto &ht_offset = ht_offsets[r];
		ht_offset = ApplyBitMask(hash);
		occupied_count += entries[ht_offset].IsOccupied(); // Lookup
		D_ASSERT(ht_offset == hash % capacity);
		hash_salts[r] = ht_entry_t::ExtractSalt(hash);
	}

	idx_t new_group_count = 0;
	idx_t remaining_entries = chunk_size;
	idx_t iteration_count;
	for (iteration_count = 0; remaining_entries > 0 && iteration_count < capacity; iteration_count++) {
		idx_t new_entry_count = 0;
		idx_t need_compare_count = 0;
		idx_t no_match_count = 0;

		// For each remaining entry, figure out whether or not it belongs to a full or empty group
		for (idx_t i = 0; i < remaining_entries; i++) {
			const auto index = sel_vector->get_index(i);
			const auto salt = hash_salts[index];
			auto &ht_offset = ht_offsets[index];

			idx_t inner_iteration_count;
			for (inner_iteration_count = 0; inner_iteration_count < capacity; inner_iteration_count++) {
				auto &entry = entries[ht_offset];
				if (!entry.IsOccupied()) { // Unoccupied: claim it
					entry.SetSalt(salt);
					state.empty_vector.set_index(new_entry_count++, index);
					new_groups_out.set_index(new_group_count++, index);
					break;
				}

				if (DUCKDB_LIKELY(entry.GetSalt() == salt)) { // Matching salt: compare groups
					state.group_compare_vector.set_index(need_compare_count++, index);
					break;
				}

				// Linear probing
				IncrementAndWrap(ht_offset, bitmask);
			}
			if (DUCKDB_UNLIKELY(inner_iteration_count == capacity)) {
				throw InternalException("Maximum inner iteration count reached in GroupedAggregateHashTable");
			}
		}

		if (DUCKDB_UNLIKELY(occupied_count > new_entry_count + need_compare_count)) {
			// We use the useless occupied_count we summed above here so the variable is used,
			// and the compiler cannot optimize away the vectorized lookups above. This should never be triggered.
			throw InternalException("Internal validation failed in GroupedAggregateHashTable");
		}
		occupied_count = 0; // Have to set to 0 for next iterations

		if (new_entry_count != 0) {
			// Append everything that belongs to an empty group
			optional_ptr<PartitionedTupleData> data;
			optional_ptr<PartitionedTupleDataAppendState> append_state;
			if (radix_bits >= UNPARTITIONED_RADIX_BITS_THRESHOLD &&
			    new_entry_count / RadixPartitioning::NumberOfPartitions(radix_bits) <= 4) {
				TupleDataCollection::ToUnifiedFormat(state.unpartitioned_append_state.chunk_state, state.group_chunk);
				data = unpartitioned_data.get();
				append_state = &state.unpartitioned_append_state;
			} else {
				data = partitioned_data.get();
				append_state = &state.partitioned_append_state;
			}
			data->AppendUnified(*append_state, state.group_chunk, state.empty_vector, new_entry_count);
			RowOperations::InitializeStates(*layout_ptr, append_state->chunk_state.row_locations,
			                                *FlatVector::IncrementalSelectionVector(), new_entry_count);

			// Set the entry pointers in the 1st part of the HT now that the data has been appended
			const auto row_locations = FlatVector::GetData<data_ptr_t>(append_state->chunk_state.row_locations);
			const auto &row_sel = append_state->reverse_partition_sel;
			for (idx_t new_entry_idx = 0; new_entry_idx < new_entry_count; new_entry_idx++) {
				const auto &index = state.empty_vector[new_entry_idx];
				const auto &row_idx = row_sel[index];
				const auto &row_location = row_locations[row_idx];

				auto &entry = entries[ht_offsets[index]];

				entry.SetPointer(row_location);
				addresses[index] = row_location;
			}
		}

		if (need_compare_count != 0) {
			// Get the pointers to the rows that need to be compared
			for (idx_t need_compare_idx = 0; need_compare_idx < need_compare_count; need_compare_idx++) {
				const auto &index = state.group_compare_vector[need_compare_idx];
				const auto &entry = entries[ht_offsets[index]];
				addresses[index] = entry.GetPointer();
			}

			// Perform group comparisons
			row_matcher.Match(state.group_chunk, state.partitioned_append_state.chunk_state.vector_data,
			                  state.group_compare_vector, need_compare_count, *layout_ptr, addresses_v,
			                  &state.no_match_vector, no_match_count);
		}

		// Linear probing: each of the entries that do not match move to the next entry in the HT
		for (idx_t i = 0; i < no_match_count; i++) {
			const auto &index = state.no_match_vector[i];
			auto &ht_offset = ht_offsets[index];
			IncrementAndWrap(ht_offset, bitmask);
		}
		sel_vector = &state.no_match_vector;
		remaining_entries = no_match_count;
	}
	if (iteration_count == capacity) {
		throw InternalException("Maximum outer iteration count reached in GroupedAggregateHashTable");
	}

	count += new_group_count;
	return new_group_count;
}